

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

bool ImGui::ItemAdd(ImRect *bb,ImGuiID id,ImRect *nav_bb_arg)

{
  int *piVar1;
  ImGuiItemStatusFlags *pIVar2;
  ImRect *pIVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  uint uVar7;
  ImGuiNavLayer IVar8;
  ImGuiWindow *pIVar9;
  ImGuiWindow *pIVar10;
  ImVec2 IVar11;
  ImGuiContext *pIVar12;
  bool bVar13;
  bool bVar14;
  ImGuiID IVar15;
  ImGuiContext *g;
  ImGuiNavMoveResult *result;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  
  pIVar12 = GImGui;
  pIVar9 = GImGui->CurrentWindow;
  if (id != 0) {
    piVar1 = &(pIVar9->DC).NavLayerActiveMaskNext;
    *piVar1 = *piVar1 | (pIVar9->DC).NavLayerCurrentMask;
    IVar15 = pIVar12->NavId;
    if ((((IVar15 == id) || (pIVar12->NavAnyRequest == true)) &&
        (pIVar10 = pIVar12->NavWindow, pIVar10->RootWindowForNav == pIVar9->RootWindowForNav)) &&
       ((pIVar9 == pIVar10 || (((uint)(pIVar10->Flags | pIVar9->Flags) >> 0x17 & 1) != 0)))) {
      if (nav_bb_arg == (ImRect *)0x0) {
        nav_bb_arg = bb;
      }
      uVar7 = (pIVar9->DC).ItemFlags;
      fVar16 = (pIVar9->Pos).x;
      fVar20 = (nav_bb_arg->Min).x - fVar16;
      fVar17 = (pIVar9->Pos).y;
      fVar21 = (nav_bb_arg->Min).y - fVar17;
      fVar16 = (nav_bb_arg->Max).x - fVar16;
      fVar17 = (nav_bb_arg->Max).y - fVar17;
      if ((pIVar12->NavInitRequest == true) && (pIVar12->NavLayer == (pIVar9->DC).NavLayerCurrent))
      {
        if ((uVar7 & 0x10) == 0) {
          pIVar12->NavInitResultId = id;
          (pIVar12->NavInitResultRectRel).Min.x = fVar20;
          (pIVar12->NavInitResultRectRel).Min.y = fVar21;
          (pIVar12->NavInitResultRectRel).Max.x = fVar16;
          (pIVar12->NavInitResultRectRel).Max.y = fVar17;
          pIVar12->NavInitRequest = false;
          NavUpdateAnyRequestFlag();
          IVar15 = pIVar12->NavId;
        }
        else if (pIVar12->NavInitResultId == 0) {
          pIVar12->NavInitResultId = id;
          (pIVar12->NavInitResultRectRel).Min.x = fVar20;
          (pIVar12->NavInitResultRectRel).Min.y = fVar21;
          (pIVar12->NavInitResultRectRel).Max.x = fVar16;
          (pIVar12->NavInitResultRectRel).Max.y = fVar17;
        }
      }
      if (((IVar15 != id) || ((pIVar12->NavMoveRequestFlags & 0x10) != 0)) && ((uVar7 & 0xc) == 0))
      {
        result = &pIVar12->NavMoveResultOther;
        if (pIVar12->NavWindow == pIVar9) {
          result = &pIVar12->NavMoveResultLocal;
        }
        if ((pIVar12->NavMoveRequest == true) && (bVar13 = NavScoreItem(result,*nav_bb_arg), bVar13)
           ) {
          result->ID = id;
          result->SelectScopeId = pIVar12->MultiSelectScopeId;
          result->Window = pIVar9;
          (result->RectRel).Min.x = fVar20;
          (result->RectRel).Min.y = fVar21;
          (result->RectRel).Max.x = fVar16;
          (result->RectRel).Max.y = fVar17;
        }
        if (((pIVar12->NavMoveRequestFlags & 0x20) != 0) &&
           (bVar13 = ImRect::Overlaps(&pIVar9->ClipRect,nav_bb_arg), bVar13)) {
          fVar4 = (nav_bb_arg->Min).y;
          fVar5 = (nav_bb_arg->Max).y;
          fVar6 = (pIVar9->ClipRect).Min.y;
          fVar18 = (pIVar9->ClipRect).Max.y;
          fVar19 = fVar18;
          if (fVar5 <= fVar18) {
            fVar19 = fVar5;
          }
          if (fVar4 <= fVar18) {
            fVar18 = fVar4;
          }
          if (((fVar5 - fVar4) * 0.7 <=
               (float)(-(uint)(fVar5 < fVar6) & (uint)fVar6 | ~-(uint)(fVar5 < fVar6) & (uint)fVar19
                      ) -
               (float)(-(uint)(fVar4 < fVar6) & (uint)fVar6 | ~-(uint)(fVar4 < fVar6) & (uint)fVar18
                      )) &&
             (bVar13 = NavScoreItem(&pIVar12->NavMoveResultLocalVisibleSet,*nav_bb_arg), bVar13)) {
            (pIVar12->NavMoveResultLocalVisibleSet).ID = id;
            (pIVar12->NavMoveResultLocalVisibleSet).SelectScopeId = pIVar12->MultiSelectScopeId;
            (pIVar12->NavMoveResultLocalVisibleSet).Window = pIVar9;
            (pIVar12->NavMoveResultLocalVisibleSet).RectRel.Min.x = fVar20;
            (pIVar12->NavMoveResultLocalVisibleSet).RectRel.Min.y = fVar21;
            (pIVar12->NavMoveResultLocalVisibleSet).RectRel.Max.x = fVar16;
            (pIVar12->NavMoveResultLocalVisibleSet).RectRel.Max.y = fVar17;
          }
        }
      }
      if (pIVar12->NavId == id) {
        pIVar12->NavWindow = pIVar9;
        IVar8 = (pIVar9->DC).NavLayerCurrent;
        pIVar12->NavLayer = IVar8;
        pIVar12->NavIdIsAlive = true;
        pIVar12->NavIdTabCounter = (pIVar9->DC).FocusCounterTab;
        pIVar3 = pIVar9->NavRectRel + IVar8;
        (pIVar3->Min).x = fVar20;
        (pIVar3->Min).y = fVar21;
        (pIVar3->Max).x = fVar16;
        (pIVar3->Max).y = fVar17;
      }
    }
  }
  (pIVar9->DC).LastItemId = id;
  IVar11 = bb->Max;
  (pIVar9->DC).LastItemRect.Min = bb->Min;
  (pIVar9->DC).LastItemRect.Max = IVar11;
  (pIVar9->DC).LastItemStatusFlags = 0;
  bVar13 = IsClippedEx(bb,id,false);
  if ((!bVar13) && (bVar14 = IsMouseHoveringRect(&bb->Min,&bb->Max,true), bVar14)) {
    pIVar2 = &(pIVar9->DC).LastItemStatusFlags;
    *(byte *)pIVar2 = (byte)*pIVar2 | 1;
  }
  return !bVar13;
}

Assistant:

bool ImGui::ItemAdd(const ImRect& bb, ImGuiID id, const ImRect* nav_bb_arg)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    if (id != 0)
    {
        // Navigation processing runs prior to clipping early-out
        //  (a) So that NavInitRequest can be honored, for newly opened windows to select a default widget
        //  (b) So that we can scroll up/down past clipped items. This adds a small O(N) cost to regular navigation requests unfortunately, but it is still limited to one window.
        //      it may not scale very well for windows with ten of thousands of item, but at least NavMoveRequest is only set on user interaction, aka maximum once a frame.
        //      We could early out with "if (is_clipped && !g.NavInitRequest) return false;" but when we wouldn't be able to reach unclipped widgets. This would work if user had explicit scrolling control (e.g. mapped on a stick)
        window->DC.NavLayerActiveMaskNext |= window->DC.NavLayerCurrentMask;
        if (g.NavId == id || g.NavAnyRequest)
            if (g.NavWindow->RootWindowForNav == window->RootWindowForNav)
                if (window == g.NavWindow || ((window->Flags | g.NavWindow->Flags) & ImGuiWindowFlags_NavFlattened))
                    NavProcessItem(window, nav_bb_arg ? *nav_bb_arg : bb, id);
    }

    window->DC.LastItemId = id;
    window->DC.LastItemRect = bb;
    window->DC.LastItemStatusFlags = ImGuiItemStatusFlags_None;

#ifdef IMGUI_ENABLE_TEST_ENGINE
    if (id != 0)
        IMGUI_TEST_ENGINE_ITEM_ADD(nav_bb_arg ? *nav_bb_arg : bb, id);
#endif

    // Clipping test
    const bool is_clipped = IsClippedEx(bb, id, false);
    if (is_clipped)
        return false;
    //if (g.IO.KeyAlt) window->DrawList->AddRect(bb.Min, bb.Max, IM_COL32(255,255,0,120)); // [DEBUG]

    // We need to calculate this now to take account of the current clipping rectangle (as items like Selectable may change them)
    if (IsMouseHoveringRect(bb.Min, bb.Max))
        window->DC.LastItemStatusFlags |= ImGuiItemStatusFlags_HoveredRect;
    return true;
}